

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O1

BOOL __thiscall
Js::DynamicObject::CallToPrimitiveFunction
          (DynamicObject *this,Var toPrimitiveFunction,PropertyId propertyId,Var *result,
          ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this_00;
  code *pcVar2;
  bool bVar3;
  Attributes attributes;
  BOOL BVar4;
  RecyclableObject *pRVar5;
  undefined4 *puVar6;
  RecyclableObject *this_01;
  Type TVar7;
  Var *ppvVar8;
  anon_class_24_3_4fd9d492 local_58;
  Var *local_40;
  bool local_31;
  
  bVar3 = JavascriptConversion::IsCallable(toPrimitiveFunction);
  if (!bVar3) {
    return 0;
  }
  pRVar5 = VarTo<Js::RecyclableObject>(toPrimitiveFunction);
  this_00 = requestContext->threadContext;
  local_31 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  local_58.this = this;
  local_58.threadContext = this_00;
  local_58.toStringFunction = pRVar5;
  attributes = FunctionInfo::GetAttributes(pRVar5);
  bVar3 = ThreadContext::HasNoSideEffect(this_00,pRVar5,attributes);
  local_40 = result;
  if (bVar3) {
    pRVar5 = (RecyclableObject *)
             CallToPrimitiveFunction::anon_class_24_3_4fd9d492::operator()(&local_58);
    bVar3 = ThreadContext::IsOnStack(pRVar5);
LAB_00dc3d63:
    if (bVar3 != false) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_ToPrimitive;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      pRVar5 = (RecyclableObject *)
               CallToPrimitiveFunction::anon_class_24_3_4fd9d492::operator()(&local_58);
      bVar3 = ThreadContext::IsOnStack(pRVar5);
      goto LAB_00dc3d63;
    }
    IVar1 = this_00->implicitCallFlags;
    pRVar5 = (RecyclableObject *)
             CallToPrimitiveFunction::anon_class_24_3_4fd9d492::operator()(&local_58);
    this_00->implicitCallFlags = IVar1 | ImplicitCall_ToPrimitive;
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_ToPrimitive;
    pRVar5 = (((((((((pRVar5->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  ppvVar8 = local_40;
  this_00->reentrancySafeOrHandled = local_31;
  if (pRVar5 == (RecyclableObject *)0x0) {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x1d6,"(threadContext->IsDisableImplicitCall())",
                                  "threadContext->IsDisableImplicitCall()");
      if (!bVar3) goto LAB_00dc4001;
      *puVar6 = 0;
    }
    pRVar5 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).nullValue.ptr;
  }
  else {
    if (((ulong)pRVar5 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pRVar5 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00dc4001;
      *puVar6 = 0;
    }
    ppvVar8 = local_40;
    TVar7 = TypeIds_FirstNumberType;
    if ((((ulong)pRVar5 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar7 = TypeIds_Number, (ulong)pRVar5 >> 0x32 == 0)) {
      this_01 = UnsafeVarTo<Js::RecyclableObject>(pRVar5);
      if (this_01 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00dc4001;
        *puVar6 = 0;
      }
      TVar7 = ((this_01->type).ptr)->typeId;
      if ((0x57 < (int)TVar7) && (BVar4 = RecyclableObject::IsExternal(this_01), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00dc4001:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
    if (9 < (int)TVar7) {
      return 0;
    }
  }
  *ppvVar8 = pRVar5;
  return 1;
}

Assistant:

BOOL DynamicObject::CallToPrimitiveFunction(Var toPrimitiveFunction, PropertyId propertyId, Var* result, ScriptContext * requestContext)
    {
        if (JavascriptConversion::IsCallable(toPrimitiveFunction))
        {
            RecyclableObject* toStringFunction = VarTo<RecyclableObject>(toPrimitiveFunction);

            ThreadContext * threadContext = requestContext->GetThreadContext();
            Var aResult = threadContext->ExecuteImplicitCall(toStringFunction, ImplicitCall_ToPrimitive, [=]() -> Js::Var
            {
                // Stack object should have a pre-op bail on implicit call.  We shouldn't see them here.
                Assert(!ThreadContext::IsOnStack(this) || threadContext->HasNoSideEffect(toStringFunction));
                return CALL_FUNCTION(threadContext, toStringFunction, CallInfo(CallFlags_Value, 1), this);
            });

            if (!aResult)
            {
                // There was an implicit call and implicit calls are disabled. This would typically cause a bailout.
                Assert(threadContext->IsDisableImplicitCall());
                *result = requestContext->GetLibrary()->GetNull();
                return true;
            }

            if (JavascriptOperators::GetTypeId(aResult) <= TypeIds_LastToPrimitiveType)
            {
                *result = aResult;
                return true;
            }
        }
        return false;
    }